

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

string * __thiscall
pstack::CacheReader::readString_abi_cxx11_(string *__return_storage_ptr__,CacheReader *this,Off off)

{
  pointer ppVar1;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_basic_string<char>_>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  string local_c8;
  type_conflict1 *local_a8;
  type_conflict1 *neu;
  type *it;
  undefined1 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  local_30;
  Off local_20;
  Off off_local;
  CacheReader *this_local;
  
  local_20 = off;
  off_local = (Off)this;
  this_local = (CacheReader *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_78);
  std::make_pair<unsigned_long&,std::__cxx11::string>(&local_58,&local_20,&local_78);
  _Var2 = std::
          unordered_map<unsigned_long,std::__cxx11::string,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
          ::insert<std::pair<unsigned_long,std::__cxx11::string>>
                    ((unordered_map<unsigned_long,std::__cxx11::string,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                      *)&this->stringCache,&local_58);
  it = (type *)_Var2.first.
               super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ._M_cur;
  local_90 = _Var2.second;
  local_30.first.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               )it;
  local_30.second = (bool)local_90;
  std::
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  neu = (type_conflict1 *)
        std::
        get<0ul,std::__detail::_Node_iterator<std::pair<unsigned_long_const,std::__cxx11::string>,false,false>,bool>
                  (&local_30);
  local_a8 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<unsigned_long_const,std::__cxx11::string>,false,false>,bool>
                       (&local_30);
  if ((*local_a8 & 1U) != 0) {
    Reader::readString_abi_cxx11_(&local_c8,&this->super_Reader,local_20);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           *)neu);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&ppVar1->second,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                         *)neu);
  std::__cxx11::string::string((string *)__return_storage_ptr__,&ppVar1->second);
  return __return_storage_ptr__;
}

Assistant:

string
CacheReader::readString(Off off) const
{
    auto [it, neu] = stringCache.insert(std::make_pair(off, std::string{}));
    if (neu)
        it->second = Reader::readString(off);
    return it->second;
}